

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2connection.cpp
# Opt level: O1

void __thiscall QHttp2Connection::handleDATA(QHttp2Connection *this)

{
  QHttp2Connection *this_00;
  byte bVar1;
  Span *pSVar2;
  Entry *pEVar3;
  long lVar4;
  bool bVar5;
  quint32 qVar6;
  FrameFlags FVar7;
  QHttp2Stream *this_01;
  ulong uVar8;
  char *message;
  Http2Error errorCode;
  long in_FS_OFFSET;
  const_iterator cVar9;
  QLatin1StringView message_00;
  quint32 streamID;
  uint local_68 [2];
  code *local_60;
  undefined8 local_58;
  quint32 local_4c;
  QMetaMethodReturnArgument local_48;
  char *local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = this + 0x238;
  local_4c = Http2::Frame::streamID((Frame *)this_00);
  if (local_4c == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      message = "DATA on the connection stream";
      errorCode = PROTOCOL_ERROR;
LAB_001ec6d1:
      connectionError(this,errorCode,message);
      return;
    }
  }
  else {
    bVar5 = isInvalidStream(this,local_4c);
    if (bVar5) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        message = "DATA on invalid stream";
        errorCode = ENHANCE_YOUR_CALM;
        goto LAB_001ec6d1;
      }
    }
    else {
      this_01 = getStream(this,local_4c);
      if ((this_01->m_state & ~ReservedRemote) == HalfClosedRemote) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          message_00.m_data = "Data on closed stream";
          message_00.m_size = 0x15;
          QHttp2Stream::streamError((QHttp2Stream *)this_01,STREAM_CLOSED,message_00);
          return;
        }
      }
      else {
        qVar6 = Http2::Frame::payloadSize((Frame *)this_00);
        if (*(int *)(this + 0x294) < (int)qVar6) {
          qHttp2ConnectionLog();
          if (((byte)qHttp2ConnectionLog::category.field_2.bools.enabledDebug._q_value._M_base._M_i
              & 1) != 0) {
            local_48.metaType._0_4_ = 2;
            local_48.metaType._4_4_ = 0;
            local_48.name._0_4_ = 0;
            local_48.name._4_4_ = 0;
            local_48.data._0_4_ = 0;
            local_48.data._4_4_ = 0;
            local_30 = qHttp2ConnectionLog::category.name;
            qVar6 = Http2::Frame::payloadSize((Frame *)this_00);
            QMessageLogger::debug
                      ((char *)&local_48,
                       "[%p] Received DATA frame with payload size %u, but recvWindow is %d, sending FLOW_CONTROL_ERROR"
                       ,this,(ulong)qVar6,(ulong)*(uint *)(this + 0x294));
          }
          connectionError(this,FLOW_CONTROL_ERROR,"Flow control error");
        }
        else {
          qVar6 = Http2::Frame::payloadSize((Frame *)this_00);
          *(quint32 *)(this + 0x294) = *(int *)(this + 0x294) - qVar6;
          cVar9 = QHash<unsigned_int,_QPointer<QHttp2Stream>_>::constFindImpl<unsigned_int>
                            ((QHash<unsigned_int,_QPointer<QHttp2Stream>_> *)(this + 0x1c0),
                             &local_4c);
          if (cVar9.i.d != (Data<QHashPrivate::Node<unsigned_int,_QPointer<QHttp2Stream>_>_> *)0x0
              || cVar9.i.bucket != 0) {
            pSVar2 = (cVar9.i.d)->spans;
            uVar8 = cVar9.i.bucket >> 7;
            pEVar3 = pSVar2[uVar8].entries;
            bVar1 = pSVar2[uVar8].offsets[(uint)cVar9.i.bucket & 0x7f];
            lVar4 = *(long *)(pEVar3[bVar1].storage.data + 8);
            if (((lVar4 != 0) && (*(int *)(lVar4 + 4) != 0)) &&
               (*(long *)(pEVar3[bVar1].storage.data + 0x10) != 0)) {
              QHttp2Stream::handleDATA
                        (*(QHttp2Stream **)(pEVar3[bVar1].storage.data + 0x10),(Frame *)this_00);
            }
          }
          FVar7 = Http2::Frame::flags((Frame *)this_00);
          if (((uint)FVar7.super_QFlagsStorageHelper<Http2::FrameFlag,_4>.
                     super_QFlagsStorage<Http2::FrameFlag>.i & 1) != 0) {
            local_48.name = (char *)&local_60;
            local_60 = (code *)CONCAT44(local_60._4_4_,local_4c);
            local_48.metaType._0_4_ = 0;
            local_48.metaType._4_4_ = 0;
            QMetaObject::activate((QObject *)this,&staticMetaObject,8,&local_48.metaType);
          }
          if (*(int *)(this + 0x294) < *(int *)(this + 0x290) / 2) {
            local_60 = sendWINDOW_UPDATE;
            local_58 = 0;
            local_68[1] = 0;
            local_68[0] = *(int *)(this + 0x290) - *(int *)(this + 0x294);
            local_48.metaType._0_4_ = 0x2e0ee0;
            local_48.metaType._4_4_ = 0;
            local_48.name._0_4_ = 0;
            local_48.name._4_4_ = 0;
            local_48.data._0_4_ = 0;
            local_48.data._4_4_ = 0;
            QMetaObject::
            invokeMethodCallableHelper<bool(QHttp2Connection::*)(unsigned_int,unsigned_int),unsigned_int,unsigned_int>
                      ((ContextType *)this,(offset_in_QHttp2Connection_to_subr *)&local_60,
                       QueuedConnection,&local_48,local_68 + 1,local_68);
            *(undefined4 *)(this + 0x294) = *(undefined4 *)(this + 0x290);
          }
        }
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          return;
        }
      }
    }
  }
  __stack_chk_fail();
}

Assistant:

void QHttp2Connection::handleDATA()
{
    Q_ASSERT(inboundFrame.type() == FrameType::DATA);

    const auto streamID = inboundFrame.streamID();

    // RFC9113, 6.1: An endpoint that receives an unexpected stream identifier MUST respond
    // with a connection error.
    if (streamID == connectionStreamID)
        return connectionError(PROTOCOL_ERROR, "DATA on the connection stream");

    if (isInvalidStream(streamID))
        return connectionError(ENHANCE_YOUR_CALM, "DATA on invalid stream");

    // RFC9113, 6.1: If a DATA frame is received whose stream is not in the "open" or
    // "half-closed (local)" state, the recipient MUST respond with a stream error.
    auto stream = getStream(streamID);
    if (stream->state() == QHttp2Stream::State::HalfClosedRemote
        || stream->state() == QHttp2Stream::State::Closed) {
        return stream->streamError(Http2Error::STREAM_CLOSED,
                                   QLatin1String("Data on closed stream"));
    }

    if (qint32(inboundFrame.payloadSize()) > sessionReceiveWindowSize) {
        qCDebug(qHttp2ConnectionLog,
                "[%p] Received DATA frame with payload size %u, "
                "but recvWindow is %d, sending FLOW_CONTROL_ERROR",
                this, inboundFrame.payloadSize(), sessionReceiveWindowSize);
        return connectionError(FLOW_CONTROL_ERROR, "Flow control error");
    }

    sessionReceiveWindowSize -= inboundFrame.payloadSize();

    auto it = m_streams.constFind(streamID);
    if (it != m_streams.cend() && it.value())
        it.value()->handleDATA(inboundFrame);

    if (inboundFrame.flags().testFlag(FrameFlag::END_STREAM))
        emit receivedEND_STREAM(streamID);

    if (sessionReceiveWindowSize < maxSessionReceiveWindowSize / 2) {
        // @future[consider]: emit signal instead
        QMetaObject::invokeMethod(this, &QHttp2Connection::sendWINDOW_UPDATE, Qt::QueuedConnection,
                                  quint32(connectionStreamID),
                                  quint32(maxSessionReceiveWindowSize - sessionReceiveWindowSize));
        sessionReceiveWindowSize = maxSessionReceiveWindowSize;
    }
}